

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

Recycler * __thiscall ThreadContext::EnsureRecycler(ThreadContext *this)

{
  ArenaAllocator *alloc;
  undefined8 uVar1;
  bool bVar2;
  HeapAllocator *alloc_00;
  Recycler *pRVar3;
  RecyclableData *this_00;
  ExpirableObjectList *pEVar4;
  undefined1 local_58 [8];
  TrackAllocData data;
  AutoRecyclerPtr newRecycler;
  
  pRVar3 = this->recycler;
  if (pRVar3 == (Recycler *)0x0) {
    local_58 = (undefined1  [8])&Memory::Recycler::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_307ca64;
    data.filename._0_4_ = 0x2d1;
    alloc_00 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    pRVar3 = (Recycler *)new<Memory::HeapAllocator>(0x166e0,alloc_00,0x2f6726);
    Memory::Recycler::Recycler
              (pRVar3,this->allocationPolicyManager,&this->pageAllocator,Js::Throw::OutOfMemory,
               (ConfigFlagsTable *)&Js::Configuration::Global,
               &(this->recyclerTelemetryHostInterface).super_RecyclerTelemetryHostInterface);
    data._32_8_ = pRVar3;
    pRVar3 = BasePtr<Memory::Recycler>::operator->((BasePtr<Memory::Recycler> *)&data.line);
    Memory::Recycler::Initialize
              (pRVar3,this->isOptimizedForManyInstances,&this->threadService,false,PageHeapModeOff,
               false,false);
    pRVar3 = BasePtr<Memory::Recycler>::operator->((BasePtr<Memory::Recycler> *)&data.line);
    Memory::Recycler::SetCollectionWrapper(pRVar3,(RecyclerCollectionWrapper *)this);
    local_58 = (undefined1  [8])&RecyclableData::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_307ca64;
    data.filename._0_4_ = 0x2e1;
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)data._32_8_,(TrackAllocData *)local_58);
    this_00 = (RecyclableData *)new<Memory::Recycler>(0x240,pRVar3,0x51e21e);
    RecyclableData::RecyclableData(this_00,(Recycler *)data._32_8_);
    Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::Root
              (&this->recyclableData,this_00,(Recycler *)data._32_8_);
    if (this->isThreadBound == true) {
      pRVar3 = BasePtr<Memory::Recycler>::operator->((BasePtr<Memory::Recycler> *)&data.line);
      Memory::Recycler::SetIsThreadBound(pRVar3);
    }
    uVar1 = data._32_8_;
    data.line = 0;
    data._36_4_ = 0;
    this->recycler = (Recycler *)uVar1;
    bVar2 = Memory::RecyclerWriteBarrierManager::OnThreadInit();
    if (!bVar2) {
      Js::Throw::OutOfMemory();
    }
    alloc = &this->threadAlloc;
    pEVar4 = (ExpirableObjectList *)new<Memory::ArenaAllocator>(0x20,alloc,0x35916e);
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_DListNodeBase<ExpirableObject_*>.
    next.node = (DListNode<ExpirableObject_*> *)pEVar4;
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_DListNodeBase<ExpirableObject_*>.
    prev.list = (DListBase<ExpirableObject_*,_RealCount> *)pEVar4;
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_RealCount.count = 0;
    pEVar4->allocator = alloc;
    this->expirableObjectList = pEVar4;
    pEVar4 = (ExpirableObjectList *)new<Memory::ArenaAllocator>(0x20,alloc,0x35916e);
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_DListNodeBase<ExpirableObject_*>.
    next.node = (DListNode<ExpirableObject_*> *)pEVar4;
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_DListNodeBase<ExpirableObject_*>.
    prev.list = (DListBase<ExpirableObject_*,_RealCount> *)pEVar4;
    (pEVar4->super_DListBase<ExpirableObject_*,_RealCount>).super_RealCount.count = 0;
    pEVar4->allocator = alloc;
    this->expirableObjectDisposeList = pEVar4;
    InitializePropertyMaps(this);
    AutoRecyclerPtr::~AutoRecyclerPtr((AutoRecyclerPtr *)&data.line);
    pRVar3 = this->recycler;
  }
  if (DAT_01450864 == '\x01') {
    StressTester::StressTester((StressTester *)local_58,pRVar3);
    StressTester::Run((StressTester *)local_58);
    pRVar3 = this->recycler;
  }
  return pRVar3;
}

Assistant:

Recycler* ThreadContext::EnsureRecycler()
{
    if (recycler == NULL)
    {
        AutoRecyclerPtr newRecycler(HeapNew(Recycler, GetAllocationPolicyManager(), &pageAllocator, Js::Throw::OutOfMemory, Js::Configuration::Global.flags, &recyclerTelemetryHostInterface));
        newRecycler->Initialize(isOptimizedForManyInstances, &threadService); // use in-thread GC when optimizing for many instances
        newRecycler->SetCollectionWrapper(this);

#if ENABLE_NATIVE_CODEGEN
        // This may throw, so it needs to be after the recycler is initialized,
        // otherwise, the recycler dtor may encounter problems
#if !FLOATVAR
        // TODO: we only need one of the following, one for OOP jit and one for in-proc BG JIT
        AutoPtr<CodeGenNumberThreadAllocator> localCodeGenNumberThreadAllocator(
            HeapNew(CodeGenNumberThreadAllocator, newRecycler));
        AutoPtr<XProcNumberPageSegmentManager> localXProcNumberPageSegmentManager(
            HeapNew(XProcNumberPageSegmentManager, newRecycler));
#endif
#endif

        this->recyclableData.Root(RecyclerNewZ(newRecycler, RecyclableData, newRecycler), newRecycler);

        if (this->IsThreadBound())
        {
            newRecycler->SetIsThreadBound();
        }

        // Assign the recycler to the ThreadContext after everything is initialized, because an OOM during initialization would
        // result in only partial initialization, so the 'recycler' member variable should remain null to cause full
        // reinitialization when requested later. Anything that happens after the Detach must have special cleanup code.
        this->recycler = newRecycler.Detach();

        try
        {
#ifdef RECYCLER_WRITE_BARRIER
#ifdef TARGET_64
            if (!RecyclerWriteBarrierManager::OnThreadInit())
            {
                Js::Throw::OutOfMemory();
            }
#endif
#endif

            this->expirableObjectList = Anew(&this->threadAlloc, ExpirableObjectList, &this->threadAlloc);
            this->expirableObjectDisposeList = Anew(&this->threadAlloc, ExpirableObjectList, &this->threadAlloc);

            InitializePropertyMaps(); // has many dependencies on the recycler and other members of the thread context
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
            this->codeGenNumberThreadAllocator = localCodeGenNumberThreadAllocator.Detach();
            this->xProcNumberPageSegmentManager = localXProcNumberPageSegmentManager.Detach();
#endif
#endif
        }
        catch(...)
        {
            // Initialization failed, undo what was done above. Callees that throw must clean up after themselves.
            if (this->recyclableData != nullptr)
            {
                this->recyclableData.Unroot(this->recycler);
            }

            {
                // AutoRecyclerPtr's destructor takes care of shutting down the background thread and deleting the recycler
                AutoRecyclerPtr recyclerToDelete(this->recycler);
                this->recycler = nullptr;
            }

            throw;
        }

        JS_ETW(EventWriteJSCRIPT_GC_INIT(this->recycler, this->GetHiResTimer()->Now()));
    }

#if DBG
    if (CONFIG_FLAG(RecyclerTest))
    {
        StressTester test(recycler);
        test.Run();
    }
#endif

    return recycler;
}